

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.c
# Opt level: O0

_Bool rtosc_match(char *pattern,char *msg,char **path_end)

{
  char *pcVar1;
  char *in_RDX;
  char *in_RSI;
  char *arg_pattern;
  char **in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  pcVar1 = rtosc_match_path(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (pcVar1 == (char *)0x0) {
    local_1 = false;
  }
  else if (*pcVar1 == ':') {
    local_1 = rtosc_match_args(in_RSI,in_RDX);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool rtosc_match(const char *pattern,
                 const char *msg, const char** path_end)
{
    const char *arg_pattern = rtosc_match_path(pattern, msg, path_end);
    if(!arg_pattern)
        return false;
    else if(*arg_pattern == ':')
        return rtosc_match_args(arg_pattern, msg);
    return true;
}